

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_codec_err_t
aom_codec_enc_init_ver
          (aom_codec_ctx_t *ctx,aom_codec_iface_t *iface,aom_codec_enc_cfg_t *cfg,
          aom_codec_flags_t flags,int ver)

{
  ulong in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int aom_encoder_abi_version_25;
  aom_codec_err_t res;
  aom_codec_ctx_t *in_stack_ffffffffffffffb8;
  undefined8 local_38;
  aom_codec_err_t local_28;
  
  if ((in_R8D == 0x1d) || (in_R8D == 0x19)) {
    if ((in_RDI == (undefined8 *)0x0) || ((in_RSI == (undefined8 *)0x0 || (in_RDX == 0)))) {
      local_28 = AOM_CODEC_INVALID_PARAM;
    }
    else if (*(int *)(in_RSI + 1) == 7) {
      if ((in_RSI[2] & 2) == 0) {
        local_28 = AOM_CODEC_INCAPABLE;
      }
      else if (((in_RCX & 0x10000) == 0) || ((in_RSI[2] & 0x10000) != 0)) {
        if (((in_RCX & 0x40000) == 0) || ((in_RSI[2] & 0x40000) != 0)) {
          if ((*(uint *)(in_RDX + 0x20) < 9) || ((in_RCX & 0x40000) != 0)) {
            in_RDI[1] = in_RSI;
            *in_RDI = *in_RSI;
            in_RDI[6] = 0;
            in_RDI[4] = in_RCX;
            in_RDI[5] = in_RDX;
            local_28 = (**(code **)(in_RDI[1] + 0x18))(in_RDI);
            if (local_28 != AOM_CODEC_OK) {
              if (in_RDI[6] == 0) {
                local_38 = 0;
              }
              else {
                local_38 = *(undefined8 *)in_RDI[6];
              }
              in_RDI[3] = local_38;
              aom_codec_destroy(in_stack_ffffffffffffffb8);
            }
          }
          else {
            local_28 = AOM_CODEC_INVALID_PARAM;
            in_RDI[3] = "High bit-depth used without the AOM_CODEC_USE_HIGHBITDEPTH flag.";
          }
        }
        else {
          local_28 = AOM_CODEC_INCAPABLE;
        }
      }
      else {
        local_28 = AOM_CODEC_INCAPABLE;
      }
    }
    else {
      local_28 = AOM_CODEC_ABI_MISMATCH;
    }
  }
  else {
    local_28 = AOM_CODEC_ABI_MISMATCH;
  }
  if (in_RDI != (undefined8 *)0x0) {
    *(aom_codec_err_t *)(in_RDI + 2) = local_28;
  }
  return local_28;
}

Assistant:

aom_codec_err_t aom_codec_enc_init_ver(aom_codec_ctx_t *ctx,
                                       aom_codec_iface_t *iface,
                                       const aom_codec_enc_cfg_t *cfg,
                                       aom_codec_flags_t flags, int ver) {
  aom_codec_err_t res;
  // The value of AOM_ENCODER_ABI_VERSION in libaom v3.0.0 and v3.1.0 - v3.1.3.
  //
  // We are compatible with these older libaom releases. AOM_ENCODER_ABI_VERSION
  // was incremented after these releases for two reasons:
  // 1. AOM_ENCODER_ABI_VERSION takes contribution from
  //    AOM_EXT_PART_ABI_VERSION. The external partition API is still
  //    experimental, so it should not be considered as part of the stable ABI.
  //    fd9ed8366 External partition: Define APIs
  //    https://aomedia-review.googlesource.com/c/aom/+/135663
  // 2. As a way to detect the presence of speeds 7-9 in all-intra mode. I (wtc)
  //    suggested this change because I misunderstood how
  //    AOM_ENCODER_ABI_VERSION was used.
  //    bbdfa68d1 AllIntra: Redefine all-intra mode speed features for speed 7+
  //    https://aomedia-review.googlesource.com/c/aom/+/140624
  const int aom_encoder_abi_version_25 = 25;

  // TODO(bug aomedia:3228): Remove the check for aom_encoder_abi_version_25 in
  // libaom v4.0.0.
  if (ver != AOM_ENCODER_ABI_VERSION && ver != aom_encoder_abi_version_25)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!ctx || !iface || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (iface->abi_version != AOM_CODEC_INTERNAL_ABI_VERSION)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!(iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else if ((flags & AOM_CODEC_USE_PSNR) && !(iface->caps & AOM_CODEC_CAP_PSNR))
    res = AOM_CODEC_INCAPABLE;
  else if ((flags & AOM_CODEC_USE_HIGHBITDEPTH) &&
           !(iface->caps & AOM_CODEC_CAP_HIGHBITDEPTH)) {
    res = AOM_CODEC_INCAPABLE;
  } else if (cfg->g_bit_depth > 8 &&
             (flags & AOM_CODEC_USE_HIGHBITDEPTH) == 0) {
    res = AOM_CODEC_INVALID_PARAM;
    ctx->err_detail =
        "High bit-depth used without the AOM_CODEC_USE_HIGHBITDEPTH flag.";
  } else {
    ctx->iface = iface;
    ctx->name = iface->name;
    ctx->priv = NULL;
    ctx->init_flags = flags;
    ctx->config.enc = cfg;
    res = ctx->iface->init(ctx);

    if (res) {
      // IMPORTANT: ctx->priv->err_detail must be null or point to a string
      // that remains valid after ctx->priv is destroyed, such as a C string
      // literal. This makes it safe to call aom_codec_error_detail() after
      // aom_codec_enc_init_ver() failed.
      ctx->err_detail = ctx->priv ? ctx->priv->err_detail : NULL;
      aom_codec_destroy(ctx);
    }
  }

  return SAVE_STATUS(ctx, res);
}